

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction_common.cpp
# Opt level: O2

bool cfd::core::operator<=(OutPoint *source,OutPoint *dest)

{
  int iVar1;
  
  iVar1 = OutPoint::Compare(source,dest);
  return -1 < iVar1;
}

Assistant:

bool operator<=(const OutPoint &source, const OutPoint &dest) {
  int comp = source.Compare(dest);
  if (comp == 0) {
    return true;
  } else if (comp > 0) {
    return true;
  } else {
    return false;
  }
}